

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void saucyGateWay(Abc_Ntk_t *pNtkOrig,Abc_Obj_t *pNodePo,FILE *gFile,int fBooleanMatching,
                 int fLookForSwaps,int fFixOutputs,int fFixInputs,int fQuiet,int fPrintTree)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pNode;
  Vec_Int_t **ppVVar4;
  Vec_Int_t **ppVVar5;
  long lVar6;
  clock_t cVar7;
  char *pcVar8;
  Abc_Ntk_t *pNtk;
  saucy *s;
  Vec_Ptr_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Ptr_t **ppVVar11;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  int *piVar14;
  void *pvVar15;
  ulong uVar16;
  FILE *pFVar17;
  clock_t cVar18;
  uint uVar19;
  code *pcVar20;
  int iVar21;
  int iVar22;
  long *plVar23;
  long lVar24;
  size_t __size;
  byte *pbVar25;
  long lVar26;
  long lVar27;
  saucy_stats stats;
  int local_68;
  saucy_stats local_50;
  
  cVar7 = clock();
  if (pNodePo == (Abc_Obj_t *)0x0) {
    pNtk = Abc_NtkDup(pNtkOrig);
  }
  else {
    pNode = (Abc_Obj_t *)pNodePo->pNtk->vObjs->pArray[*(pNodePo->vFanins).pArray];
    pcVar8 = Abc_ObjName(pNodePo);
    pNtk = Abc_NtkCreateCone(pNtkOrig,pNode,pcVar8,0);
  }
  if (pNtk->vPis->nSize == 0) {
    Abc_Print(0,"This output is not dependent on any input\n");
    Abc_NtkDelete(pNtk);
    return;
  }
  s = saucy_alloc(pNtk);
  printf("Build functional dependency graph (dependency stats are below) ... ");
  ppVVar4 = s->iDep;
  ppVVar5 = s->oDep;
  pVVar9 = Sim_ComputeFunSupp(pNtk,0);
  if (0 < pNtk->vPos->nSize) {
    lVar27 = 0;
    do {
      if (0 < pNtk->vPis->nSize) {
        pbVar25 = (byte *)pVVar9->pArray[lVar27];
        iVar21 = 0;
        do {
          if ((*pbVar25 & 1) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21);
          }
          if ((*pbVar25 & 2) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 1);
          }
          if ((*pbVar25 & 4) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 2);
          }
          if ((*pbVar25 & 8) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 3);
          }
          if ((*pbVar25 & 0x10) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 4);
          }
          if ((*pbVar25 & 0x20) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 5);
          }
          if ((*pbVar25 & 0x40) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 6);
          }
          if ((char)*pbVar25 < '\0') {
            Vec_IntPushOrder(ppVVar5[lVar27],iVar21 + 7);
          }
          pbVar25 = pbVar25 + 1;
          iVar21 = iVar21 + 8;
        } while (iVar21 < pNtk->vPis->nSize);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < pNtk->vPos->nSize);
  }
  if (0 < pNtk->vPos->nSize) {
    lVar27 = 0;
    do {
      pVVar10 = ppVVar5[lVar27];
      if (0 < pVVar10->nSize) {
        lVar26 = 0;
        do {
          Vec_IntPush(ppVVar4[pVVar10->pArray[lVar26]],(int)lVar27);
          lVar26 = lVar26 + 1;
          pVVar10 = ppVVar5[lVar27];
        } while (lVar26 < pVVar10->nSize);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < pNtk->vPos->nSize);
  }
  puts("\t--------------------");
  pVVar9 = pNtk->vPis;
  lVar27 = (long)pVVar9->nSize;
  ppVVar11 = (Vec_Ptr_t **)malloc(lVar27 * 8);
  if (0 < lVar27) {
    lVar27 = 0;
    do {
      pVVar12 = (Vec_Ptr_t *)malloc(0x10);
      pVVar12->nCap = 0x32;
      pVVar12->nSize = 0;
      ppvVar13 = (void **)malloc(400);
      pVVar12->pArray = ppvVar13;
      ppVVar11[lVar27] = pVVar12;
      lVar27 = lVar27 + 1;
    } while (lVar27 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar27 = 0;
    do {
      plVar23 = (long *)pVVar9->pArray[lVar27];
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar21 = pNtk->vObjs->nSize;
        uVar16 = (long)iVar21 + 500;
        iVar22 = (int)uVar16;
        if ((pNtk->vTravIds).nCap < iVar22) {
          piVar14 = (int *)malloc(uVar16 * 4);
          (pNtk->vTravIds).pArray = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_0030c372;
          (pNtk->vTravIds).nCap = iVar22;
        }
        if (-500 < iVar21) {
          memset((pNtk->vTravIds).pArray,0,(uVar16 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar22;
      }
      iVar21 = pNtk->nTravIds;
      pNtk->nTravIds = iVar21 + 1;
      if (0x3ffffffe < iVar21) {
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      lVar26 = *plVar23;
      uVar1 = *(undefined4 *)(lVar26 + 0xd8);
      uVar2 = *(uint *)(plVar23 + 2);
      if (*(int *)(lVar26 + 0xe4) <= (int)uVar2) {
        lVar24 = (long)(int)uVar2 + 1;
        iVar21 = *(int *)(lVar26 + 0xe0);
        lVar6 = (long)iVar21 * 2;
        if ((int)uVar2 < (int)lVar6) {
          if (iVar21 < (int)lVar6 && iVar21 <= (int)uVar2) {
            __size = (long)iVar21 << 3;
            if (*(void **)(lVar26 + 0xe8) == (void *)0x0) {
              pvVar15 = malloc(__size);
            }
            else {
              pvVar15 = realloc(*(void **)(lVar26 + 0xe8),__size);
            }
            *(void **)(lVar26 + 0xe8) = pvVar15;
joined_r0x0030bf32:
            if (pvVar15 == (void *)0x0) {
LAB_0030c372:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *(int *)(lVar26 + 0xe0) = (int)lVar6;
          }
        }
        else if (iVar21 <= (int)uVar2) {
          if (*(void **)(lVar26 + 0xe8) == (void *)0x0) {
            pvVar15 = malloc(lVar24 * 4);
          }
          else {
            pvVar15 = realloc(*(void **)(lVar26 + 0xe8),lVar24 * 4);
          }
          *(void **)(lVar26 + 0xe8) = pvVar15;
          lVar6 = lVar24;
          goto joined_r0x0030bf32;
        }
        iVar21 = *(int *)(lVar26 + 0xe4);
        if (iVar21 <= (int)uVar2) {
          memset((void *)((long)iVar21 * 4 + *(long *)(lVar26 + 0xe8)),0,
                 (ulong)(uVar2 - iVar21) * 4 + 4);
        }
        *(int *)(lVar26 + 0xe4) = (int)lVar24;
      }
      if (((int)uVar2 < 0) || (*(int *)(lVar26 + 0xe4) <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar26 + 0xe8) + (ulong)uVar2 * 4) = uVar1;
      if (*(int *)*plVar23 == 1) {
        plVar23 = *(long **)(*(long *)(*(long *)((int *)*plVar23 + 8) + 8) +
                            (long)*(int *)plVar23[6] * 8);
      }
      if (0 < *(int *)((long)plVar23 + 0x2c)) {
        pVVar9 = ppVVar11[lVar27];
        lVar26 = 0;
        do {
          Abc_NtkDfsReverse_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar23 + 0x20) + 8) +
                      (long)*(int *)(plVar23[6] + lVar26 * 4) * 8),pVVar9);
          lVar26 = lVar26 + 1;
        } while (lVar26 < *(int *)((long)plVar23 + 0x2c));
      }
      lVar27 = lVar27 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar27 < pVVar9->nSize);
  }
  s->topOrder = ppVVar11;
  uVar2 = pNtk->vPos->nSize;
  uVar3 = pNtk->vPis->nSize;
  piVar14 = (int *)malloc((long)(int)(uVar3 + uVar2) << 2);
  if (fFixOutputs == 0) {
    if (0 < (int)uVar2) {
      memset(piVar14,0,(ulong)uVar2 * 4);
    }
  }
  else if (0 < (int)uVar2) {
    uVar16 = 0;
    do {
      piVar14[uVar16] = (int)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar2 != uVar16);
  }
  if (fFixInputs == 0) {
    uVar19 = 1;
    if (fFixOutputs != 0) {
      uVar19 = uVar2;
    }
    if (0 < (int)uVar3) {
      uVar16 = 0;
      do {
        piVar14[(long)(int)uVar2 + uVar16] = uVar19;
        uVar16 = uVar16 + 1;
      } while (uVar3 != uVar16);
    }
  }
  else if (0 < (int)uVar3) {
    uVar19 = 1;
    if (fFixOutputs != 0) {
      uVar19 = uVar2;
    }
    uVar16 = 0;
    do {
      piVar14[(long)(int)uVar2 + uVar16] = uVar19 + (int)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar3 != uVar16);
  }
  s->fBooleanMatching = fBooleanMatching;
  NUM_SIM1_ITERATION = 0x32;
  if (fBooleanMatching == 0) {
    NUM_SIM1_ITERATION = 200;
  }
  pcVar20 = print_automorphism_quiet;
  if (fQuiet == 0) {
    pcVar20 = print_automorphism_ntk;
  }
  NUM_SIM2_ITERATION = NUM_SIM1_ITERATION;
  s->print_automorphism = pcVar20;
  if (gFile == (FILE *)0x0) {
    gFile = (FILE *)_stdout;
  }
  s->gFile = gFile;
  s->fPrintTree = fPrintTree;
  s->fLookForSwaps = fLookForSwaps;
  saucy_search(pNtk,s,0,piVar14,&local_50);
  pFVar17 = _stdout;
  fprintf(_stdout,"group size = %fe%d\n",local_50.grpsize_base,(ulong)(uint)local_50.grpsize_exp);
  fprintf(pFVar17,"levels = %d\n",(ulong)(uint)local_50.levels);
  fprintf(pFVar17,"nodes = %d\n",(ulong)(uint)local_50.nodes);
  fprintf(pFVar17,"generators = %d\n",(ulong)(uint)local_50.gens);
  fprintf(pFVar17,"total support = %d\n",(ulong)(uint)local_50.support);
  fprintf(pFVar17,"average support = %.2f\n",(double)local_50.support / (double)local_50.gens);
  fprintf(pFVar17,"nodes per generator = %.2f\n",(double)local_50.nodes / (double)local_50.gens);
  fprintf(pFVar17,"bad nodes = %d\n",local_50.bads);
  if (fBooleanMatching != 0) {
    pcVar8 = "*** Networks are NOT equivalent ***";
    if (0 < local_50.grpsize_exp) {
      pcVar8 = "*** Networks are equivalent ***";
    }
    if (1.0 < local_50.grpsize_base) {
      pcVar8 = "*** Networks are equivalent ***";
    }
    puts(pcVar8);
  }
  saucy_free(s);
  Abc_NtkDelete(pNtk);
  pFVar17 = fopen("hadi.txt","a");
  fprintf(pFVar17,"group size = %fe%d\n",local_50.grpsize_base,(ulong)(uint)local_50.grpsize_exp);
  fclose(pFVar17);
  Abc_Print(1,"%s =","Runtime");
  cVar18 = clock();
  local_68 = (int)cVar7;
  Abc_Print(1,"%9.2f sec\n",(double)(cVar18 - local_68) / 1000000.0);
  return;
}

Assistant:

void saucyGateWay( Abc_Ntk_t * pNtkOrig, Abc_Obj_t * pNodePo, FILE * gFile, int fBooleanMatching, 
                   int fLookForSwaps, int fFixOutputs, int fFixInputs, int fQuiet, int fPrintTree )
{
    Abc_Ntk_t * pNtk;
    struct saucy *s;
    struct saucy_stats stats;
    int *colors;
    int i, clk = clock();   
    
    if (pNodePo == NULL)
        pNtk = Abc_NtkDup( pNtkOrig );
    else
        pNtk = Abc_NtkCreateCone( pNtkOrig, Abc_ObjFanin0(pNodePo), Abc_ObjName(pNodePo), 0 );
    
    if (Abc_NtkPiNum(pNtk) == 0) {
        Abc_Print( 0, "This output is not dependent on any input\n" );
        Abc_NtkDelete( pNtk );
        return;
    }

    s = saucy_alloc( pNtk );    

    /******* Getting Dependencies *******/  
    printf("Build functional dependency graph (dependency stats are below) ... ");      
    getDependencies( pNtk, s->iDep, s->oDep );
    printf("\t--------------------\n");
    /************************************/

    /* Finding toplogical orde */
    s->topOrder = findTopologicalOrder( pNtk );                 

    /* Setting graph colors: outputs = 0 and inputs = 1 */
    colors = ints(Abc_NtkPoNum(pNtk) + Abc_NtkPiNum(pNtk));
    if (fFixOutputs) {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = i;
    } else {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = 0;
    }
    if (fFixInputs) {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c+i;     
    } else {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c;   
    }   

    /* Are we looking for Boolean matching? */
    s->fBooleanMatching = fBooleanMatching;
    if (fBooleanMatching) {
        NUM_SIM1_ITERATION = 50;
        NUM_SIM2_ITERATION = 50;
    } else {
        NUM_SIM1_ITERATION = 200;
        NUM_SIM2_ITERATION = 200;
    }

    /* Set the print automorphism routine */
    if (!fQuiet)
        s->print_automorphism = print_automorphism_ntk;
    else
        s->print_automorphism = print_automorphism_quiet;

    /* Set the output file for generators */
    if (gFile == NULL)
        s->gFile = stdout;
    else
        s->gFile = gFile;

    /* Set print tree option */
    s->fPrintTree = fPrintTree;

    /* Set input permutations option */
    s->fLookForSwaps = fLookForSwaps;

    saucy_search(pNtk, s, 0, colors, &stats);   
    print_stats(stdout, stats);
    if (fBooleanMatching) {
        if (stats.grpsize_base > 1 || stats.grpsize_exp > 0)
            printf("*** Networks are equivalent ***\n");
        else
            printf("*** Networks are NOT equivalent ***\n");
    }
    saucy_free(s);
    Abc_NtkDelete(pNtk);

    if (1) {
        FILE * hadi = fopen("hadi.txt", "a");
        fprintf(hadi, "group size = %fe%d\n",
        stats.grpsize_base, stats.grpsize_exp); 
        fclose(hadi);
    }

    ABC_PRT( "Runtime", clock() - clk );

}